

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddMisc.c
# Opt level: O2

int Cudd_zddDagSize(DdNode *p_node)

{
  int iVar1;
  st__table *tab;
  
  tab = st__init_table(st__ptrcmp,st__ptrhash);
  iVar1 = cuddZddDagInt(p_node,tab);
  st__free_table(tab);
  return iVar1;
}

Assistant:

int
Cudd_zddDagSize(
  DdNode * p_node)
{

    int         i;
    st__table    *table;

    table = st__init_table( st__ptrcmp, st__ptrhash);
    i = cuddZddDagInt(p_node, table);
    st__free_table(table);
    return(i);

}